

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O2

void add_region(level *lev,region *reg)

{
  region **__src;
  monst *mon;
  boolean bVar1;
  byte bVar2;
  region **__dest;
  uint uVar3;
  int iVar4;
  uint y;
  
  iVar4 = lev->n_regions;
  uVar3 = lev->max_regions;
  if ((int)uVar3 <= iVar4) {
    __src = lev->regions;
    __dest = (region **)malloc((long)(int)uVar3 * 8 + 0x50);
    lev->regions = __dest;
    if (0 < (int)uVar3) {
      memcpy(__dest,__src,(ulong)uVar3 << 3);
      free(__src);
      iVar4 = lev->n_regions;
      uVar3 = lev->max_regions;
    }
    lev->max_regions = uVar3 + 10;
  }
  reg->lev = lev;
  lev->regions[iVar4] = reg;
  lev->n_regions = iVar4 + 1;
  for (uVar3 = (uint)(reg->bounding_box).lx; (int)uVar3 <= (int)(reg->bounding_box).hx;
      uVar3 = uVar3 + 1) {
    for (y = (uint)(reg->bounding_box).ly; (int)y <= (int)(reg->bounding_box).hy; y = y + 1) {
      if (y < 0x15 && uVar3 - 1 < 0x4f) {
        mon = lev->monsters[uVar3][y];
        if (((mon != (monst *)0x0) && ((mon->field_0x61 & 2) == 0)) &&
           (bVar1 = inside_region(reg,uVar3,y), bVar1 != '\0')) {
          add_mon_to_reg(reg,mon);
        }
        if ((reg->visible != '\0') && ((viz_array[y][uVar3] & 2U) != 0)) {
          newsym(uVar3,y);
        }
      }
    }
  }
  bVar2 = inside_region(reg,(int)u.ux,(int)u.uy);
  reg->player_flags = reg->player_flags & 0xfeU | bVar2;
  return;
}

Assistant:

void add_region(struct level *lev, struct region *reg)
{
    struct region **tmp_reg;
    int i, j;

    if (lev->max_regions <= lev->n_regions) {
	tmp_reg = lev->regions;
	lev->regions = malloc(sizeof (struct region *) * (lev->max_regions + 10));
	if (lev->max_regions > 0) {
	    memcpy(lev->regions, tmp_reg,
			  lev->max_regions * sizeof (struct region *));
	    free(tmp_reg);
	}
	lev->max_regions += 10;
    }
    reg->lev = lev;
    lev->regions[lev->n_regions] = reg;
    lev->n_regions++;
    /* Check for monsters inside the region */
    for (i = reg->bounding_box.lx; i <= reg->bounding_box.hx; i++)
	for (j = reg->bounding_box.ly; j <= reg->bounding_box.hy; j++) {
	    /* Some lev->regions can cross the level boundaries */
	    if (!isok(i,j))
		continue;
	    if (MON_AT(lev, i, j) && inside_region(reg, i, j))
		add_mon_to_reg(reg, lev->monsters[i][j]);
	    if (reg->visible && cansee(i, j))
		newsym(i, j);
	}
    /* Check for player now... */
    if (inside_region(reg, u.ux, u.uy))
	set_hero_inside(reg);
    else
	clear_hero_inside(reg);
}